

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::CumulativeReporterBase::SectionNode> * __thiscall
Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
          (Ptr<Catch::CumulativeReporterBase::SectionNode> *this,
          Ptr<Catch::CumulativeReporterBase::SectionNode> *other)

{
  Ptr<Catch::CumulativeReporterBase::SectionNode> *in_RDI;
  Ptr<Catch::CumulativeReporterBase::SectionNode> temp;
  Ptr<Catch::CumulativeReporterBase::SectionNode> *in_stack_ffffffffffffffd8;
  
  Ptr(in_RDI,in_stack_ffffffffffffffd8);
  swap(in_RDI,in_stack_ffffffffffffffd8);
  ~Ptr(in_RDI);
  return in_RDI;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }